

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O2

void dmrC_vrfy_flow(entrypoint *ep)

{
  basic_block *bb;
  undefined1 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  basic_block *pbVar4;
  undefined1 local_60 [8];
  ptr_list_iter jmpiter__;
  ptr_list_iter bbiter__;
  
  pbVar4 = ep->entry->bb;
  ptrlist_forward_iterator((ptr_list_iter *)&jmpiter__.__nr,(ptr_list *)ep->bbs);
  do {
    bb = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&jmpiter__.__nr);
    if (bb == (basic_block *)0x0) {
      if (pbVar4 == (basic_block *)0x0) {
        return;
      }
      __assert_fail("!entry",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/flow.c"
                    ,0x392,"void dmrC_vrfy_flow(struct entrypoint *)");
    }
    if (bb == pbVar4) {
      pbVar4 = (basic_block *)0x0;
    }
    puVar1 = (undefined1 *)ptrlist_last((ptr_list *)bb->insns);
    if (puVar1 == (undefined1 *)0x0) {
      if (bb->children != (basic_block_list *)0x0) {
        __assert_fail("!bb->children",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/flow.c"
                      ,0x368,"void vrfy_children(struct basic_block *)");
      }
    }
    else {
      switch(*puVar1) {
      case 4:
        vrfy_bb_in_list(*(basic_block **)(puVar1 + 0x30),bb->children);
      case 3:
        vrfy_bb_in_list(*(basic_block **)(puVar1 + 0x28),bb->children);
        break;
      case 5:
      case 7:
        ptrlist_forward_iterator((ptr_list_iter *)local_60,*(ptr_list **)(puVar1 + 0x28));
        while (puVar2 = (undefined8 *)ptrlist_iter_next((ptr_list_iter *)local_60),
              puVar2 != (undefined8 *)0x0) {
          vrfy_bb_in_list((basic_block *)*puVar2,bb->children);
        }
      }
      ptrlist_forward_iterator((ptr_list_iter *)local_60,(ptr_list *)bb->children);
      while (pvVar3 = ptrlist_iter_next((ptr_list_iter *)local_60), pvVar3 != (void *)0x0) {
        vrfy_bb_in_list(bb,*(basic_block_list **)((long)pvVar3 + 0x20));
      }
    }
    ptrlist_forward_iterator((ptr_list_iter *)local_60,(ptr_list *)bb->parents);
    while (pvVar3 = ptrlist_iter_next((ptr_list_iter *)local_60), pvVar3 != (void *)0x0) {
      vrfy_bb_in_list(bb,*(basic_block_list **)((long)pvVar3 + 0x28));
    }
  } while( true );
}

Assistant:

void dmrC_vrfy_flow(struct entrypoint *ep)
{
	struct basic_block *bb;
	struct basic_block *entry = ep->entry->bb;

	FOR_EACH_PTR(ep->bbs, bb) {
		if (bb == entry)
			entry = NULL;
		vrfy_bb_flow(bb);
	} END_FOR_EACH_PTR(bb);
	assert(!entry);
}